

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  uint uVar1;
  LodePNGColorProfile prof;
  LodePNGColorProfile local_440;
  
  local_440.alpha = 0;
  local_440.numcolors = 0;
  local_440._0_6_ = 0;
  local_440.key._2_2_ = 0;
  local_440.key_r = 0;
  local_440.key_g = 0;
  local_440.key_b = 0;
  local_440.bits = 1;
  local_440.numpixels = 0;
  lodepng_get_color_profile(&local_440,image,w,h,mode_in);
  uVar1 = auto_choose_color_from_profile(mode_out,mode_in,&local_440);
  return uVar1;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
                                   const unsigned char* image, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  unsigned error = 0;
  LodePNGColorProfile prof;
  lodepng_color_profile_init(&prof);
  error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
  if(error) return error;
  return auto_choose_color_from_profile(mode_out, mode_in, &prof);
}